

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Typename.cpp
# Opt level: O0

void __thiscall
enact::OptionalTypename::OptionalTypename(OptionalTypename *this,OptionalTypename *typename_)

{
  pointer pTVar1;
  unique_ptr<enact::Typename,_std::default_delete<enact::Typename>_> local_28;
  unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_> local_20;
  OptionalTypename *local_18;
  OptionalTypename *typename__local;
  OptionalTypename *this_local;
  
  local_18 = typename_;
  typename__local = this;
  pTVar1 = std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>::
           operator->(&typename_->m_wrappedTypename);
  (*pTVar1->_vptr_Typename[2])();
  std::unique_ptr<enact::Typename_const,std::default_delete<enact::Typename_const>>::
  unique_ptr<enact::Typename,std::default_delete<enact::Typename>,void>
            ((unique_ptr<enact::Typename_const,std::default_delete<enact::Typename_const>> *)
             &local_20,&local_28);
  OptionalTypename(this,&local_20);
  std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>::~unique_ptr
            (&local_20);
  std::unique_ptr<enact::Typename,_std::default_delete<enact::Typename>_>::~unique_ptr(&local_28);
  return;
}

Assistant:

OptionalTypename::OptionalTypename(const OptionalTypename &typename_) :
            OptionalTypename{typename_.m_wrappedTypename->clone()} {
    }